

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

bool baryonyx::itm::
     is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>,baryonyx::bit_array>
               (solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                *slv,int k,bit_array *x)

{
  int iVar1;
  int iVar2;
  bool local_59;
  int local_54;
  tuple<baryonyx::sparse_matrix<int>::row_value_const*&,baryonyx::sparse_matrix<int>::row_value_const*&>
  local_50 [4];
  int v;
  undefined1 local_40 [24];
  const_row_iterator et;
  const_row_iterator it;
  bit_array *x_local;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Stack_10;
  int k_local;
  solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
  *slv_local;
  
  it = (const_row_iterator)x;
  x_local._4_4_ = k;
  _Stack_10._M_head_impl = (col_value *)slv;
  sparse_matrix<int>::row((sparse_matrix<int> *)local_40,(int)slv + 8);
  std::
  tie<baryonyx::sparse_matrix<int>::row_value_const*,baryonyx::sparse_matrix<int>::row_value_const*>
            ((row_value **)local_50,&et);
  std::
  tuple<baryonyx::sparse_matrix<int>::row_value_const*&,baryonyx::sparse_matrix<int>::row_value_const*&>
  ::operator=(local_50,(tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
                        *)local_40);
  local_54 = 0;
  for (; et != (const_row_iterator)local_40._16_8_; et = et + 1) {
    iVar1 = solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
            ::factor((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                      *)_Stack_10._M_head_impl,et->value);
    iVar2 = bit_array::operator[]((bit_array *)it,et->column);
    local_54 = iVar1 * iVar2 + local_54;
  }
  iVar1 = solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
          ::bound_min((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                       *)_Stack_10._M_head_impl,x_local._4_4_);
  local_59 = false;
  if (iVar1 <= local_54) {
    iVar1 = solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
            ::bound_max((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                         *)_Stack_10._M_head_impl,x_local._4_4_);
    local_59 = local_54 <= iVar1;
  }
  return local_59;
}

Assistant:

bool
is_valid_constraint(const Solver& slv, int k, const Xtype& x)
{
    typename sparse_matrix<int>::const_row_iterator it, et;

    std::tie(it, et) = slv.ap.row(k);
    int v = 0;

    for (; it != et; ++it)
        v += slv.factor(it->value) * x[it->column];

    return slv.bound_min(k) <= v && v <= slv.bound_max(k);
}